

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O1

_Bool borg_tell(char *what)

{
  char cVar1;
  char *pcVar2;
  
  borg_keypress(0x3a);
  cVar1 = *what;
  if (cVar1 != '\0') {
    pcVar2 = what + 1;
    do {
      borg_keypress((int)cVar1);
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  borg_keypress(0x9c);
  return true;
}

Assistant:

bool borg_tell(char* what)
{
    /* Hack -- self note */
    borg_keypress(':');
    borg_keypresses(what);
    borg_keypress(KC_ENTER);

    /* Success */
    return (true);
}